

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::QStyleSheetStyle(QStyleSheetStyle *this,QStyle *base)

{
  QStyleSheetStyleCaches *this_00;
  QStyleSheetStyleCaches *pQVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  QWindowsStylePrivate *in_stack_ffffffffffffffd8;
  
  this_00 = (QStyleSheetStyleCaches *)operator_new(0x158);
  QStyleSheetStylePrivate::QStyleSheetStylePrivate((QStyleSheetStylePrivate *)this_00);
  QWindowsStyle::QWindowsStyle((QWindowsStyle *)this_00,in_stack_ffffffffffffffd8);
  *in_RDI = &PTR_metaObject_00d0acb8;
  in_RDI[2] = in_RSI;
  *(undefined4 *)(in_RDI + 3) = 1;
  QCss::Parser::Parser((Parser *)(in_RDI + 4));
  numinstances = numinstances + 1;
  if (numinstances == 1) {
    pQVar1 = (QStyleSheetStyleCaches *)operator_new(0x48);
    QStyleSheetStyleCaches::QStyleSheetStyleCaches(this_00);
    styleSheetCaches = pQVar1;
  }
  return;
}

Assistant:

QStyleSheetStyle::QStyleSheetStyle(QStyle *base)
    : QWindowsStyle(*new QStyleSheetStylePrivate), base(base), refcount(1)
{
    ++numinstances;
    if (numinstances == 1) {
        styleSheetCaches = new QStyleSheetStyleCaches;
    }
}